

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_HRR_Writer.cpp
# Opt level: O3

string * __thiscall
OSTEI_HRR_Writer::HRRBraStepVar_
          (string *__return_storage_ptr__,OSTEI_HRR_Writer *this,Doublet *d,string *ncart_ket,
          string *ketstr)

{
  pointer pcVar1;
  char *pcVar2;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int __c;
  Doublet *dbra;
  string local_b8;
  string arrname;
  undefined1 local_78 [32];
  _Alloc_hider local_58;
  char local_48 [24];
  
  local_78._0_4_ = d->type;
  local_78._4_4_ = (d->left).ijk._M_elems[0];
  local_78._8_4_ = (d->left).ijk._M_elems[1];
  local_78._12_4_ = (d->left).ijk._M_elems[2];
  local_78._16_4_ = (d->right).ijk._M_elems[0];
  local_78._20_4_ = (d->right).ijk._M_elems[1];
  local_78._24_4_ = (d->right).ijk._M_elems[2];
  pcVar1 = (d->tag)._M_dataplus._M_p;
  local_58._M_p = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + (d->tag)._M_string_length);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"");
  dbra = (Doublet *)local_78;
  ArrVarName(&arrname,dbra,ketstr,&local_b8);
  __c = extraout_EDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
    __c = extraout_EDX_00;
  }
  if (local_58._M_p != local_48) {
    operator_delete(local_58._M_p);
    __c = extraout_EDX_01;
  }
  pcVar2 = Doublet::index(d,(char *)dbra,__c);
  local_b8._M_dataplus._M_p._0_4_ = (int)pcVar2;
  StringBuilder<char[5],std::__cxx11::string&,char_const(&)[2],int,char_const(&)[4],std::__cxx11::string_const&,char_const(&)[9]>
            (__return_storage_ptr__,(char (*) [5])0x14a2fc,&arrname,(char (*) [2])0x14a093,
             (int *)&local_b8,(char (*) [4])0x149b4f,ncart_ket,(char (*) [9])" + iket]");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)arrname._M_dataplus._M_p != &arrname.field_2) {
    operator_delete(arrname._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string OSTEI_HRR_Writer::HRRBraStepVar_(const Doublet & d, const std::string & ncart_ket, 
                                             const std::string & ketstr) const
{
    std::string arrname = ArrVarName(d, ketstr);
    return StringBuilder("HRR_", arrname, "[", d.index(), " * ", ncart_ket, " + iket]"); 
}